

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O0

void __thiscall
Assimp::EmbedTexturesProcess::SetupProperties(EmbedTexturesProcess *this,Importer *pImp)

{
  string local_90 [55];
  allocator<char> local_59;
  string local_58;
  string local_38;
  Importer *local_18;
  Importer *pImp_local;
  EmbedTexturesProcess *this_local;
  
  local_18 = pImp;
  pImp_local = (Importer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
  Importer::GetPropertyString(&local_38,pImp,"sourceFilePath",&local_58);
  std::__cxx11::string::operator=((string *)&this->mRootPath,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  std::__cxx11::string::find_last_of((char *)&this->mRootPath,0xbad9f5);
  std::__cxx11::string::substr((ulong)local_90,(ulong)&this->mRootPath);
  std::__cxx11::string::operator=((string *)&this->mRootPath,local_90);
  std::__cxx11::string::~string(local_90);
  return;
}

Assistant:

void EmbedTexturesProcess::SetupProperties(const Importer* pImp) {
    mRootPath = pImp->GetPropertyString("sourceFilePath");
    mRootPath = mRootPath.substr(0, mRootPath.find_last_of("\\/") + 1u);
}